

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pos_tagger_test.cpp
# Opt level: O2

void __thiscall PosTaggerTest_Test_Test::~PosTaggerTest_Test_Test(PosTaggerTest_Test_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PosTaggerTest, Test) {
  MixSegment tagger("../dict/jieba.dict.utf8", "../dict/hmm_model.utf8");
  {
    vector<pair<string, string> > res;
    tagger.Tag(QUERY_TEST1, res);
    string s;
    s << res;
    ASSERT_TRUE(s == ANS_TEST1);
  }
}